

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum4096.c
# Opt level: O3

_Bool Hacl_Bignum4096_mod_exp_vartime
                (uint64_t *n,uint64_t *a,uint32_t bBits,uint64_t *b,uint64_t *res)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint32_t i;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t local_238 [65];
  
  uVar1 = exp_check(n,a,bBits,b);
  uVar4 = 0;
  uVar5 = 0;
  do {
    uVar2 = FStar_UInt64_eq_mask(n[uVar4],0);
    uVar5 = (uVar5 ^ uVar4) & uVar2 ^ uVar4;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x40);
  if (uVar1 == 0xffffffffffffffff) {
    memset(local_238,0,0x200);
    *(byte *)(local_238 + ((uint)uVar5 & 0x3ffffff)) = (byte)local_238[(uint)uVar5 & 0x3ffffff] | 1;
    iVar3 = (uint)uVar5 * 0x40 + -0x2000;
    if (iVar3 != 0) {
      iVar3 = -iVar3;
      do {
        Hacl_Bignum4096_add_mod(n,local_238,local_238,local_238);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    uVar2 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(*n);
    exp_vartime_precomp(n,uVar2,local_238,a,bBits,b,res);
  }
  else {
    memset(res,0,0x200);
  }
  return uVar1 == 0xffffffffffffffff;
}

Assistant:

bool
Hacl_Bignum4096_mod_exp_vartime(
  uint64_t *n,
  uint64_t *a,
  uint32_t bBits,
  uint64_t *b,
  uint64_t *res
)
{
  uint64_t is_valid_m = exp_check(n, a, bBits, b);
  uint32_t nBits = 64U * (uint32_t)Hacl_Bignum_Lib_bn_get_top_index_u64(64U, n);
  if (is_valid_m == 0xFFFFFFFFFFFFFFFFULL)
  {
    exp_vartime(nBits, n, a, bBits, b, res);
  }
  else
  {
    memset(res, 0U, 64U * sizeof (uint64_t));
  }
  return is_valid_m == 0xFFFFFFFFFFFFFFFFULL;
}